

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_compareTo(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  ushort uVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  ushort *puVar5;
  ushort *puVar6;
  vm_obj_id_t vVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *p;
  
  if (getp_compareTo(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_compareTo();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_compareTo::desc);
  if (iVar2 != 0) {
    return 1;
  }
  pbVar9 = (byte *)(ulong)*(ushort *)str;
  puVar5 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
  if (puVar5 == (ushort *)0x0) {
    err_throw(0x7e3);
  }
  uVar1 = *puVar5;
  pbVar8 = (byte *)(ulong)uVar1;
  retval->typ = VM_NIL;
  if (uVar1 != 0 && pbVar9 != (byte *)0x0) {
    p = (byte *)(str + 2);
    puVar5 = puVar5 + 1;
    do {
      wVar3 = utf8_ptr::s_getch((char *)p);
      wVar4 = utf8_ptr::s_getch((char *)puVar5);
      vVar7 = wVar3 - wVar4;
      if (vVar7 != 0) goto LAB_002b61ea;
      puVar6 = (ushort *)
               ((long)puVar5 +
               (ulong)((((byte)*puVar5 >> 5 & 1) != 0) + 1 & (uint)(byte)((byte)*puVar5 >> 7) * 3) +
               1);
      pbVar8 = (byte *)((long)puVar5 + ((long)pbVar8 - (long)puVar6));
      pbVar9 = p + ((long)pbVar9 -
                   (long)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1));
    } while ((pbVar9 != (byte *)0x0) &&
            (p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1, puVar5 = puVar6,
            pbVar8 != (byte *)0x0));
    if (retval->typ != VM_NIL) goto LAB_002b61f3;
  }
  vVar7 = (int)pbVar9 - (int)pbVar8;
LAB_002b61ea:
  retval->typ = VM_INT;
  (retval->val).obj = vVar7;
LAB_002b61f3:
  sp_ = sp_ + -1;
  return 1;
}

Assistant:

int CVmObjString::getp_compareTo(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* get the other string (leave it on the stack for gc protection) */
    const char *other = G_stk->get(0)->get_as_string(vmg0_);
    if (other == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get its buffer and length */
    size_t olen = vmb_get_len(other);
    other += VMB_LEN;

    /* no result yet */
    retval->set_nil();

    /* compare character by character */
    utf8_ptr a((char *)str);
    utf8_ptr b((char *)other);
    for ( ; len != 0 && olen != 0 ; a.inc(&len), b.inc(&olen))
    {
        int delta = (int)a.getch() - (int)b.getch();
        if (delta != 0)
        {
            retval->set_int(delta);
            break;
        }
    }

    /* if we didn't find any differences, the shorter string sorts first */
    if (retval->typ == VM_NIL)
        retval->set_int(len - olen);

    /* discard arguments */
    G_stk->discard(1);

    /* done */
    return TRUE;
}